

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<cfd::core::AddressType&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,AddressType *args)

{
  bool bVar1;
  undefined8 in_RCX;
  CfdLogLevel in_ESI;
  CfdSourceLocation *in_RDI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args_00;
  string_view format_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_cfd::core::AddressType>
  *vargs;
  char **in_stack_ffffffffffffff28;
  string local_b8;
  undefined8 local_98;
  undefined8 local_90;
  CfdLogLevel local_84;
  CfdSourceLocation *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_78;
  basic_string_view<char> local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  undefined8 local_40;
  undefined8 *local_38;
  string *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_8;
  
  local_98 = in_RCX;
  local_84 = in_ESI;
  local_80 = in_RDI;
  bVar1 = IsEnableLogLevel(in_ESI);
  if (bVar1) {
    local_38 = &local_90;
    local_40 = local_98;
    local_30 = &local_b8;
    local_58.named_args.data =
         (named_arg_info<char> *)
         ::fmt::v7::make_args_checked<cfd::core::AddressType&,char_const*,char>
                   (in_stack_ffffffffffffff28,
                    (remove_reference_t<cfd::core::AddressType_&> *)0x555ced);
    local_48 = &local_58;
    local_68 = ::fmt::v7::to_string_view<char,_0>((char *)*local_38);
    local_20 = &local_78;
    local_28 = local_48;
    local_18 = local_48;
    local_8 = local_48;
    local_10 = local_20;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_20,2,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_48->string);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_78.field_1.values_;
    format_str.size_ = local_78.desc_;
    format_str.data_ = (char *)local_68.size_;
    ::fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_68.data_,format_str,args_00);
    WriteLog(local_80,local_84,&local_b8);
    ::std::__cxx11::string::~string((string *)&local_b8);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}